

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O2

bool doesReverseUpdateWorks<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  uchar outchar;
  uint uVar1;
  uint32_conflict uVar2;
  uint uVar3;
  uint uVar4;
  uchar inchar;
  int iVar5;
  bool bVar6;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  CyclicHash<unsigned_int,_unsigned_char> hf;
  mersenneRNG generator;
  
  MTRand::seed(&generator.mtr);
  generator.n = 5;
  iVar5 = 3;
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&hf,3,L);
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_Deque_base
            (&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
    uVar2 = mersenneRNG::operator()(&generator);
    c = (char)uVar2 + 'A';
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)
               &s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>,&c);
    CyclicHash<unsigned_int,_unsigned_char>::eat(&hf,c);
  }
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar4 == 100000) break;
    outchar = *s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&s);
    uVar2 = mersenneRNG::operator()(&generator);
    inchar = (char)uVar2 + 'A';
    c = inchar;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>(&s,&c);
    CyclicHash<unsigned_int,_unsigned_char>::update(&hf,outchar,inchar);
    CyclicHash<unsigned_int,_unsigned_char>::reverse_update(&hf,outchar,inchar);
    CyclicHash<unsigned_int,_unsigned_char>::update(&hf,outchar,inchar);
    uVar3 = CyclicHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((CyclicHash<unsigned_int,unsigned_char> *)&hf,&s);
    uVar1 = uVar4 + 1;
  } while (uVar3 == hf.hashvalue);
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base
            (&s.super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return 99999 < uVar4;
}

Assistant:

bool doesReverseUpdateWorks(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);
    s.push_back(c);
    hf.update(out, c);
    hf.reverse_update(out, c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      return false;
    }
  }
  return true;
}